

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void kratos::stmt_set_right(AssignStmt *stmt,Var *target,Var *new_var)

{
  Var *pVVar1;
  VarType VVar2;
  InternalException *this;
  undefined1 local_80 [24];
  string local_68;
  enable_shared_from_this<kratos::Var> local_38;
  pointer local_28;
  Var **right;
  Var *new_var_local;
  Var *target_local;
  AssignStmt *stmt_local;
  
  right = (Var **)new_var;
  new_var_local = target;
  target_local = (Var *)stmt;
  local_28 = (pointer)AssignStmt::right(stmt);
  VVar2 = Var::type((Var *)(local_28->
                           super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   );
  if (((VVar2 == Base) ||
      (VVar2 = Var::type((Var *)(local_28->
                                super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr), VVar2 == PortIO)) ||
     (VVar2 = Var::type((Var *)(local_28->
                               super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr), VVar2 == ConstValue)) {
    pVVar1 = target_local;
    if ((Var *)(local_28->super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        != new_var_local) {
      local_80[0x16] = 1;
      this = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Target not found",(allocator<char> *)(local_80 + 0x17));
      InternalException::InternalException(this,&local_68);
      local_80[0x16] = 0;
      __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
    }
    std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_38);
    AssignStmt::set_right((AssignStmt *)pVVar1,(shared_ptr<kratos::Var> *)&local_38);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_38);
    pVVar1 = (Var *)(local_28->super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
    (*(pVVar1->super_IRNode)._vptr_IRNode[0x14])(pVVar1,right);
  }
  else {
    VVar2 = Var::type((Var *)(local_28->
                             super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
    if (VVar2 == Slice) {
      set_slice_var_parent((Var **)local_28,new_var_local,(Var *)right,true);
    }
    else {
      VVar2 = Var::type((Var *)(local_28->
                               super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
      if (VVar2 == Expression) {
        AssignStmt::right((AssignStmt *)target_local);
        Var::as<kratos::Expr>((Var *)local_80);
        change_var_expr((shared_ptr<kratos::Expr> *)local_80,new_var_local,(Var *)right,true);
        std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_80);
      }
      else {
        change_var_parent((Var **)local_28,new_var_local,(Var *)right);
      }
    }
  }
  return;
}

Assistant:

void stmt_set_right(AssignStmt *stmt, Var *target, Var *new_var) {
    auto &right = stmt->right();
    if (right->type() == VarType::Base || right->type() == VarType::PortIO ||
        right->type() == VarType::ConstValue) {
        if (right == target) {
            stmt->set_right(new_var->shared_from_this());
            right->move_linked_to(new_var);
        } else {
            throw InternalException("Target not found");
        }
    } else if (right->type() == VarType::Slice) {
        set_slice_var_parent(right, target, new_var, true);
    } else if (right->type() == VarType::Expression) {
        change_var_expr(stmt->right()->as<Expr>(), target, new_var);
    } else {
        change_var_parent(right, target, new_var);
    }
}